

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  uint32_t *puVar1;
  int iVar2;
  LRUHandle *pLVar3;
  LRUHandle **ppLVar4;
  long lVar5;
  LRUCache *this_00;
  Mutex *__mutex;
  Slice local_40;
  
  lVar5 = 0;
  do {
    __mutex = &this->shard_[lVar5].mutex_;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    this_00 = this->shard_ + lVar5;
    pLVar3 = (this_00->lru_).next;
    if (pLVar3 != &this_00->lru_) {
      do {
        local_40.data_ = pLVar3->key_data;
        local_40.size_ = pLVar3->key_length;
        ppLVar4 = HandleTable::FindPointer(&this_00->table_,&local_40,pLVar3->hash);
        pLVar3 = *ppLVar4;
        if (pLVar3 != (LRUHandle *)0x0) {
          *ppLVar4 = pLVar3->next_hash;
          puVar1 = &(this_00->table_).elems_;
          *puVar1 = *puVar1 - 1;
        }
        LRUCache::FinishErase(this_00,pLVar3);
        pLVar3 = (this_00->lru_).next;
      } while (pLVar3 != &this_00->lru_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  return;
}

Assistant:

void Prune() override {
    for (int s = 0; s < kNumShards; s++) {
      shard_[s].Prune();
    }
  }